

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O2

DThinker * __thiscall
FDecalColorerAnim::CreateThinker(FDecalColorerAnim *this,DBaseDecal *actor,side_t *wall)

{
  DDecalColorer *this_00;
  int iVar1;
  
  this_00 = (DDecalColorer *)DObject::operator_new(0x50);
  DDecalColorer::DDecalColorer(this_00,actor);
  iVar1 = *(int *)&(this->super_FDecalAnimator).field_0xc + level.maptime;
  this_00->TimeToStartDecay = iVar1;
  this_00->TimeToEndDecay = iVar1 + this->DecayTime;
  (this_00->StartColor).field_0.d = 0xff000000;
  (this_00->GoalColor).field_0 = (this->GoalColor).field_0;
  return (DThinker *)this_00;
}

Assistant:

DThinker *FDecalColorerAnim::CreateThinker (DBaseDecal *actor, side_t *wall) const
{
	DDecalColorer *Colorer = new DDecalColorer (actor);

	Colorer->TimeToStartDecay = level.maptime + DecayStart;
	Colorer->TimeToEndDecay = Colorer->TimeToStartDecay + DecayTime;
	Colorer->StartColor = 0xff000000;
	Colorer->GoalColor = GoalColor;
	return Colorer;
}